

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_GetPrototypePrimitive(JSContext *ctx,JSValue val)

{
  undefined1 auVar1 [16];
  long lVar2;
  uint uVar3;
  ulong uVar5;
  JSValue JVar6;
  ulong uVar4;
  
  lVar2 = 0x40;
  uVar3 = val.u._0_4_ + 8;
  uVar4 = (ulong)uVar3;
  if (uVar3 < 10) {
    uVar5 = (long)&switchD_0011cac4::switchdataD_00177f28 +
            (long)(int)(&switchD_0011cac4::switchdataD_00177f28)[uVar4];
    switch(uVar4) {
    case 0:
      lVar2 = 0x70;
      break;
    case 1:
      lVar2 = 0x50;
      break;
    default:
switchD_0011cac4_caseD_2:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      return (JSValue)(auVar1 << 0x40);
    case 8:
      break;
    case 9:
      lVar2 = 0x60;
    }
  }
  else {
    uVar5 = uVar4;
    if (val.u._0_4_ != 7) goto switchD_0011cac4_caseD_2;
  }
  JVar6.tag = uVar5;
  JVar6.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + lVar2))->ptr;
  return JVar6;
}

Assistant:

static JSValueConst JS_GetPrototypePrimitive(JSContext *ctx, JSValueConst val)
{
    switch(JS_VALUE_GET_NORM_TAG(val)) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        val = ctx->class_proto[JS_CLASS_BIG_INT];
        break;
    case JS_TAG_BIG_FLOAT:
        val = ctx->class_proto[JS_CLASS_BIG_FLOAT];
        break;
    case JS_TAG_BIG_DECIMAL:
        val = ctx->class_proto[JS_CLASS_BIG_DECIMAL];
        break;
#endif
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
        val = ctx->class_proto[JS_CLASS_NUMBER];
        break;
    case JS_TAG_BOOL:
        val = ctx->class_proto[JS_CLASS_BOOLEAN];
        break;
    case JS_TAG_STRING:
        val = ctx->class_proto[JS_CLASS_STRING];
        break;
    case JS_TAG_SYMBOL:
        val = ctx->class_proto[JS_CLASS_SYMBOL];
        break;
    case JS_TAG_OBJECT:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
    default:
        val = JS_NULL;
        break;
    }
    return val;
}